

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_GetSampleSize(PaSampleFormat format)

{
  ulong uVar1;
  
  uVar1 = format & 0xffffffff7fffffff;
  if ((long)uVar1 < 8) {
    if (uVar1 - 1 < 2) {
      return 4;
    }
    if (uVar1 == 4) {
      return 3;
    }
  }
  else {
    if (uVar1 == 0x20) {
      return 1;
    }
    if (uVar1 == 0x10) {
      return 1;
    }
    if (uVar1 == 8) {
      return 2;
    }
  }
  return -0x270a;
}

Assistant:

PaError Pa_GetSampleSize( PaSampleFormat format )
{
    int result;

    PA_LOGAPI_ENTER_PARAMS( "Pa_GetSampleSize" );
    PA_LOGAPI(("\tPaSampleFormat format: %d\n", format ));

    switch( format & ~paNonInterleaved )
    {

    case paUInt8:
    case paInt8:
        result = 1;
        break;

    case paInt16:
        result = 2;
        break;

    case paInt24:
        result = 3;
        break;

    case paFloat32:
    case paInt32:
        result = 4;
        break;

    default:
        result = paSampleFormatNotSupported;
        break;
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_GetSampleSize", "int: %d", result );

    return (PaError) result;
}